

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O0

detail * __thiscall prometheus::detail::base64url_encode(detail *this,string *input)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  string *input_local;
  string *s;
  
  base64_encode(this,input);
  iVar1 = ::std::begin<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  iVar2 = ::std::end<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  iVar3 = ::std::begin<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,prometheus::detail::base64url_encode(std::__cxx11::string_const&)::_lambda(char)_1_>
            (iVar1._M_current,iVar2._M_current,iVar3._M_current);
  return this;
}

Assistant:

inline std::string base64url_encode(const std::string& input) {
  std::string s = base64_encode(input);
  std::transform(begin(s), end(s), begin(s), [](char c) {
    if (c == '+') return '-';
    if (c == '/') return '_';
    return c;
  });
  return s;
}